

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variable_table.cpp
# Opt level: O2

void __thiscall Variable_table::print_vars(Variable_table *this)

{
  pointer ppVVar1;
  Variable *this_00;
  pointer ppVVar2;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_90,"------ VARIABLES ------",&local_91);
  cout_log(&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  endl_log();
  ppVVar1 = (this->vars).super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar2 = (this->vars).super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppVVar2 != ppVVar1; ppVVar2 = ppVVar2 + 1) {
    this_00 = *ppVVar2;
    std::__cxx11::string::string((string *)&local_50,"INTEGER ",&local_91);
    cout_log(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    Variable::get_name_abi_cxx11_(&local_70,this_00);
    cout_log(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    endl_log();
  }
  return;
}

Assistant:

void Variable_table::print_vars()
{
	cout_log("------ VARIABLES ------");
	endl_log();
	for (auto variable : vars) {
		cout_log("INTEGER ");
		cout_log(variable->get_name());
		endl_log();
	}
}